

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

nni_msg * nni_msg_unique(nni_msg *m)

{
  int iVar1;
  nni_msg *pnVar2;
  nni_msg *local_20;
  nni_msg *m2;
  
  iVar1 = nni_atomic_get(&m->m_refcnt);
  pnVar2 = m;
  if (iVar1 != 1) {
    iVar1 = nni_msg_dup(&local_20,m);
    pnVar2 = local_20;
    if (iVar1 != 0) {
      pnVar2 = (nni_msg *)0x0;
    }
    nni_msg_free(m);
  }
  return pnVar2;
}

Assistant:

nni_msg *
nni_msg_unique(nni_msg *m)
{
	nni_msg *m2;

	// If we already have an exclusive copy, just keep using it.
	if (nni_atomic_get(&m->m_refcnt) == 1) {
		return (m);
	}
	// Otherwise we need to make a copy
	if (nni_msg_dup(&m2, m) != 0) {
		m2 = NULL;
	}
	nni_msg_free(m);
	return (m2);
}